

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

int32_t getDotType(UChar32 c)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  uint16_t *pe;
  uint uStack_c;
  uint16_t props;
  UChar32 c_local;
  
  uVar2 = c >> 5;
  if ((uint)c < 0xd800) {
    local_2c = (uint)ucase_props_trieIndex[(int)uVar2] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar3 = 0;
      if (c < 0xdc00) {
        iVar3 = 0x140;
      }
      local_30 = (uint)ucase_props_trieIndex[(int)(iVar3 + uVar2)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_38 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar2 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_38 = 0x2f1c;
        }
        local_34 = local_38;
      }
      else {
        local_34 = 0xd30;
      }
      local_30 = local_34;
    }
    local_2c = local_30;
  }
  uVar1 = ucase_props_trieIndex[local_2c];
  if ((uVar1 & 8) == 0) {
    uStack_c = (uint)uVar1;
  }
  else {
    uStack_c = (int)(uint)ucase_props_exceptions[(int)(uint)uVar1 >> 4] >> 7;
  }
  uStack_c = uStack_c & 0x60;
  return uStack_c;
}

Assistant:

static inline int32_t
getDotType(UChar32 c) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        return props&UCASE_DOT_MASK;
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        return (*pe>>UCASE_EXC_DOT_SHIFT)&UCASE_DOT_MASK;
    }
}